

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_concat(lua_State *L,int total)

{
  TValue *obj;
  byte bVar1;
  StkId top;
  lua_CFunction p_Var2;
  ushort uVar3;
  ulong uVar4;
  TString *pTVar5;
  TValue *io1;
  TValue *p1;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong l;
  char buff [40];
  char acStack_58 [40];
  
  if (total < 2) {
    __assert_fail("total >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x326,"void luaV_concat(lua_State *, int)");
  }
  do {
    top = L->top;
    p1 = top + -2;
    if ((ushort)((top[-2].tt_ & 0xf) - 3) < 2) {
      obj = top + -1;
      uVar3 = top[-1].tt_ & 0xf;
      if (uVar3 != 4) {
        if (uVar3 != 3) goto LAB_0013e66e;
        luaO_tostring(L,obj);
      }
      uVar3 = top[-1].tt_;
      if (uVar3 == 0x8004) {
        if (((byte)(obj->value_).f[8] & 0xf) != 4) {
          __assert_fail("(((((top - 1)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32c,"void luaV_concat(lua_State *, int)");
        }
        if ((obj->value_).f[0xb] == (_func_int_lua_State_ptr)0x0) {
          iVar7 = 1;
          if ((top[-2].tt_ & 0xf) == 3) {
            luaO_tostring(L,p1);
          }
          goto LAB_0013e7c3;
        }
      }
      if (top[-2].tt_ == 0x8004) {
        if (((byte)(p1->value_).f[8] & 0xf) != 4) {
          __assert_fail("(((((top - 2)->value_).gc)->tt) & 0x0F) == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x32e,"void luaV_concat(lua_State *, int)");
        }
        if ((p1->value_).f[0xb] == (_func_int_lua_State_ptr)0x0) {
          top[-2].value_ = top[-1].value_;
          top[-2].tt_ = uVar3;
          iVar7 = 1;
          if (((short)uVar3 < 0) &&
             (((uVar3 & 0x7f) != (ushort)((p1->value_).gc)->tt ||
              ((L != (lua_State *)0x0 &&
               ((((p1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x32f,"void luaV_concat(lua_State *, int)");
          }
          goto LAB_0013e7c3;
        }
      }
      if ((uVar3 & 0xf) != 4) {
        pcVar6 = "(((((((top - 1))->tt_)) & 0x0F)) == (4))";
LAB_0013e8bd:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x333,"void luaV_concat(lua_State *, int)");
      }
      p_Var2 = (obj->value_).f;
      if (((byte)p_Var2[8] & 0xf) != 4) {
        pcVar6 = "(((((top - 1)->value_).gc)->tt) & 0x0F) == 4";
        goto LAB_0013e8bd;
      }
      if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
        l = (ulong)(byte)p_Var2[0xb];
      }
      else {
        l = *(ulong *)(p_Var2 + 0x10);
      }
      uVar8 = 1;
      if (1 < total) {
        uVar8 = 1;
        do {
          uVar3 = p1->tt_ & 0xf;
          if (uVar3 != 4) {
            if (uVar3 != 3) goto LAB_0013e72a;
            luaO_tostring(L,p1);
          }
          if ((p1->tt_ & 0xf) != 4) {
            pcVar6 = "(((((((top - n - 1))->tt_)) & 0x0F)) == (4))";
LAB_0013e88c:
            __assert_fail(pcVar6,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x337,"void luaV_concat(lua_State *, int)");
          }
          p_Var2 = (p1->value_).f;
          if (((byte)p_Var2[8] & 0xf) != 4) {
            pcVar6 = "(((((top - n - 1)->value_).gc)->tt) & 0x0F) == 4";
            goto LAB_0013e88c;
          }
          if (p_Var2[8] == (_func_int_lua_State_ptr)0x4) {
            uVar4 = (ulong)(byte)p_Var2[0xb];
          }
          else {
            uVar4 = *(ulong *)(p_Var2 + 0x10);
          }
          if ((l ^ 0x7fffffffffffffff) <= uVar4) {
            luaG_runerror(L,"string length overflow");
          }
          l = l + uVar4;
          uVar8 = uVar8 + 1;
          p1 = p1 + -1;
        } while ((uint)total != uVar8);
        uVar8 = (ulong)(uint)total;
      }
LAB_0013e72a:
      iVar7 = (int)uVar8;
      if (l < 0x29) {
        copy2buff(top,iVar7,acStack_58);
        pTVar5 = luaS_newlstr(L,acStack_58,l);
      }
      else {
        pTVar5 = luaS_createlngstrobj(L,l);
        copy2buff(top,iVar7,(char *)(pTVar5 + 1));
      }
      if (9 < (pTVar5->tt & 0xe)) {
        pcVar6 = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_0013e8dc:
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x345,"void luaV_concat(lua_State *, int)");
      }
      top[-(uVar8 & 0xffffffff)].value_.gc = (GCObject *)pTVar5;
      bVar1 = pTVar5->tt;
      top[-(uVar8 & 0xffffffff)].tt_ = bVar1 | 0x8000;
      if (((char)bVar1 < '\0') ||
         ((L != (lua_State *)0x0 && ((pTVar5->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        pcVar6 = "0";
        goto LAB_0013e8dc;
      }
      iVar7 = iVar7 + -1;
    }
    else {
LAB_0013e66e:
      luaT_trybinTM(L,p1,top + -1,p1,TM_CONCAT);
      iVar7 = 1;
    }
LAB_0013e7c3:
    total = total - iVar7;
    L->top = L->top + -(long)iVar7;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || cvt2str(top-2)) || !tostring(L, top-1))
      luaT_trybinTM(L, top-2, top-1, top-2, TM_CONCAT);
    else if (isemptystr(top - 1))  /* second operand is empty? */
      cast_void(tostring(L, top - 2));  /* result is first operand */
    else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = vslen(top - 1);
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, top - n - 1); n++) {
        size_t l = vslen(top - n - 1);
        if (unlikely(l >= (MAX_SIZE/sizeof(char)) - tl))
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}